

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::InternReadFile
          (DXFImporter *this,string *filename,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  int iVar2;
  IOStream *__p;
  element_type *peVar3;
  DeadlyImportError *pDVar4;
  element_type *peVar5;
  char *__s1;
  string *s;
  basic_formatter *this_00;
  Logger *pLVar6;
  aiMatrix4x4t<float> local_3e8;
  aiMatrix4x4t<float> local_3a8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_1f0;
  byte local_1c9;
  undefined1 local_1c8 [7];
  bool eof;
  FileData output;
  LineReader reader;
  undefined1 local_138 [8];
  StreamReaderLE stream;
  string local_f8;
  char local_d8 [8];
  char buff [25];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  shared_ptr<Assimp::IOStream> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *filename_local;
  DXFImporter *this_local;
  
  file.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rb",&local_59);
  __p = IOSystem::Open(pIOHandler,filename,&local_58);
  std::shared_ptr<Assimp::IOStream>::shared_ptr<Assimp::IOStream,void>
            ((shared_ptr<Assimp::IOStream> *)local_38,__p);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  peVar3 = std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  if (peVar3 == (element_type *)0x0) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b0,"Failed to open DXF file ",filename);
    std::operator+(&local_90,&local_b0,"");
    DeadlyImportError::DeadlyImportError(pDVar4,&local_90);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  buff[0x10] = '\0';
  local_d8[0] = '\0';
  local_d8[1] = '\0';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8[4] = '\0';
  local_d8[5] = '\0';
  local_d8[6] = '\0';
  local_d8[7] = '\0';
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  peVar5 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_38);
  (*peVar5->_vptr_IOStream[2])(peVar5,local_d8,0x18,1);
  __s1 = (char *)std::__cxx11::string::c_str();
  iVar2 = strncmp(__s1,local_d8,0x18);
  if (iVar2 == 0) {
    stream._54_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"DXF: Binary files are not supported at the moment",
               (allocator<char> *)&stream.field_0x37);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_f8);
    stream._54_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  peVar5 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_38);
  (*peVar5->_vptr_IOStream[4])(peVar5,0);
  std::shared_ptr<Assimp::IOStream>::shared_ptr
            ((shared_ptr<Assimp::IOStream> *)&reader.end,(shared_ptr<Assimp::IOStream> *)local_38);
  StreamReader<false,_false>::StreamReader
            ((StreamReader<false,_false> *)local_138,(shared_ptr<Assimp::IOStream> *)&reader.end,
             false);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)&reader.end);
  DXF::LineReader::LineReader
            ((LineReader *)
             &output.blocks.
              super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(StreamReaderLE *)local_138);
  DXF::FileData::FileData((FileData *)local_1c8);
  local_1c9 = 0;
LAB_006a2e14:
  do {
    bVar1 = DXF::LineReader::End
                      ((LineReader *)
                       &output.blocks.
                        super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_006a3112:
      if ((local_1c9 & 1) == 0) {
        pLVar6 = DefaultLogger::get();
        Logger::warn(pLVar6,"DXF: EOF reached, but did not encounter DXF EOF marker");
      }
      ConvertMeshes(this,pScene,(FileData *)local_1c8);
      aiMatrix4x4t<float>::aiMatrix4x4t
                (&local_3e8,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,-1.0,0.0,0.0,0.0,0.0,0.0,1.0);
      aiMatrix4x4t<float>::operator*(&local_3a8,&local_3e8,&pScene->mRootNode->mTransformation);
      memcpy(&pScene->mRootNode->mTransformation,&local_3a8,0x40);
      DXF::FileData::~FileData((FileData *)local_1c8);
      DXF::LineReader::~LineReader
                ((LineReader *)
                 &output.blocks.
                  super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)local_138);
      std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)local_38);
      return;
    }
    bVar1 = DXF::LineReader::Is((LineReader *)
                                &output.blocks.
                                 super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,2,"BLOCKS");
    if (bVar1) {
      ParseBlocks(this,(LineReader *)
                       &output.blocks.
                        super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(FileData *)local_1c8);
      goto LAB_006a2e14;
    }
    bVar1 = DXF::LineReader::Is((LineReader *)
                                &output.blocks.
                                 super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,2,"ENTITIES");
    if (bVar1) {
      ParseEntities(this,(LineReader *)
                         &output.blocks.
                          super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(FileData *)local_1c8);
    }
    else {
      bVar1 = DXF::LineReader::Is((LineReader *)
                                  &output.blocks.
                                   super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,2,"CLASSES");
      if ((bVar1) ||
         (bVar1 = DXF::LineReader::Is((LineReader *)
                                      &output.blocks.
                                       super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,2,"TABLES"
                                     ), bVar1)) {
        SkipSection(this,(LineReader *)
                         &output.blocks.
                          super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        bVar1 = DXF::LineReader::Is((LineReader *)
                                    &output.blocks.
                                     super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,2,"HEADER");
        if (bVar1) {
          ParseHeader(this,(LineReader *)
                           &output.blocks.
                            super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(FileData *)local_1c8
                     );
        }
        else {
          bVar1 = DXF::LineReader::Is((LineReader *)
                                      &output.blocks.
                                       super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,999);
          if (bVar1) {
            pLVar6 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[14]>(&local_368,(char (*) [14])"DXF Comment: ");
            s = DXF::LineReader::Value_abi_cxx11_
                          ((LineReader *)
                           &output.blocks.
                            super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            this_00 = (basic_formatter *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )&local_368,s);
            Formatter::basic_formatter::operator_cast_to_string(&local_1f0,this_00);
            Logger::info(pLVar6,&local_1f0);
            std::__cxx11::string::~string((string *)&local_1f0);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter(&local_368);
          }
          else {
            bVar1 = DXF::LineReader::Is((LineReader *)
                                        &output.blocks.
                                         super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0,"EOF")
            ;
            if (bVar1) {
              local_1c9 = 1;
              goto LAB_006a3112;
            }
          }
          DXF::LineReader::operator++
                    ((LineReader *)
                     &output.blocks.
                      super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
  } while( true );
}

Assistant:

void DXFImporter::InternReadFile( const std::string& filename, aiScene* pScene, IOSystem* pIOHandler) {
    std::shared_ptr<IOStream> file = std::shared_ptr<IOStream>( pIOHandler->Open( filename) );

    // Check whether we can read the file
    if( file.get() == nullptr ) {
        throw DeadlyImportError( "Failed to open DXF file " + filename + "");
    }

    // Check whether this is a binary DXF file - we can't read binary DXF files :-(
    char buff[AI_DXF_BINARY_IDENT_LEN+1] = {0};
    file->Read(buff,AI_DXF_BINARY_IDENT_LEN,1);

    if (0 == strncmp(AI_DXF_BINARY_IDENT.c_str(),buff,AI_DXF_BINARY_IDENT_LEN)) {
        throw DeadlyImportError("DXF: Binary files are not supported at the moment");
    }

    // DXF files can grow very large, so read them via the StreamReader,
    // which will choose a suitable strategy.
    file->Seek(0,aiOrigin_SET);
    StreamReaderLE stream( file );

    DXF::LineReader reader (stream);
    DXF::FileData output;

    // now get all lines of the file and process top-level sections
    bool eof = false;
    while(!reader.End()) {

        // blocks table - these 'build blocks' are later (in ENTITIES)
        // referenced an included via INSERT statements.
        if (reader.Is(2,"BLOCKS")) {
            ParseBlocks(reader,output);
            continue;
        }

        // primary entity table
        if (reader.Is(2,"ENTITIES")) {
            ParseEntities(reader,output);
            continue;
        }

        // skip unneeded sections entirely to avoid any problems with them
        // altogether.
        else if (reader.Is(2,"CLASSES") || reader.Is(2,"TABLES")) {
            SkipSection(reader);
            continue;
        }

        else if (reader.Is(2,"HEADER")) {
            ParseHeader(reader,output);
            continue;
        }

        // comments
        else if (reader.Is(999)) {
            ASSIMP_LOG_INFO_F("DXF Comment: ", reader.Value());
        }

        // don't read past the official EOF sign
        else if (reader.Is(0,"EOF")) {
            eof = true;
            break;
        }

        ++reader;
    }
    if (!eof) {
        ASSIMP_LOG_WARN("DXF: EOF reached, but did not encounter DXF EOF marker");
    }

    ConvertMeshes(pScene,output);

    // Now rotate the whole scene by 90 degrees around the x axis to convert from AutoCAD's to Assimp's coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f) * pScene->mRootNode->mTransformation;
}